

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_character.cpp
# Opt level: O1

int main(void)

{
  sbyte sVar1;
  byte bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string str;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Hello World!","");
  uVar5 = *(ulong *)((long)local_50 + 6);
  if (local_48 < 0xe) {
    bVar2 = 0x40 - ('p' - (char)((int)local_48 << 3));
    sVar1 = (bVar2 < 0x41) * ('@' - bVar2);
    uVar5 = (uVar5 << sVar1) >> sVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"str = ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"packed = str[6..] = ",0x14);
  print_packed(uVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|packed| = ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sub = packed[2..2+3] = ",0x17);
  uVar6 = uVar5 >> 0x10 & 0xffffffff;
  print_packed(uVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|sub| = ",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"lcp(packed,sub) = ",0x12);
  for (uVar6 = uVar6 ^ uVar5; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"lcp(str[2..],str[9..]) = ",0x19);
  uVar6 = *(ulong *)((long)local_50 + 2);
  if (local_48 < 10) {
    bVar2 = 0x40 - ((char)local_48 * -8 + 'P');
    sVar1 = (bVar2 < 0x41) * ('@' - bVar2);
    uVar6 = (uVar6 << sVar1) >> sVar1;
  }
  uVar4 = *(ulong *)((long)local_50 + 9);
  if (local_48 < 0x11) {
    bVar2 = 0x40 - (-0x78 - (char)((int)local_48 << 3));
    sVar1 = (bVar2 < 0x41) * ('@' - bVar2);
    uVar4 = (uVar4 << sVar1) >> sVar1;
  }
  if (uVar6 != uVar4) {
    for (uVar4 = uVar4 ^ uVar6; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
    }
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"prefix = packed[1..4] = ",0x18);
  print_packed(uVar5 & 0xffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|prefix| = ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"is prefix?: ",0xc);
  for (uVar5 = uVar5 & 0xffffffff00000000; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000
      ) {
  }
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
   std::string str = "Hello World!";
   auto packed = C::construct(str, 6); // packed = str[6..]
   std::cout << "str = " << str << std::endl;
   std::cout << "packed = str[6..] = ";
   print_packed(packed);
   std::cout << "|packed| = " << static_cast<size_t>(C::char_length(packed)) << std::endl; 
   auto sub = C::substring(packed, 2,4); // sub = packed[2..2+3]
   std::cout << "sub = packed[2..2+3] = ";
   print_packed(sub); 
   std::cout << "|sub| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "lcp(packed,sub) = " << static_cast<size_t>(C::longest_common_prefix(packed, sub)) << std::endl;

   std::cout << "lcp(str[2..],str[9..]) = " << static_cast<size_t>(C::longest_common_prefix(C::construct(str,2), C::construct(str,9))) << std::endl;

   auto prefix = C::truncate(packed, 4); // prefix = packed[1..4]
   std::cout << "prefix = packed[1..4] = ";
   print_packed(prefix); 
   std::cout << "|prefix| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "is prefix?: " << C::is_prefix(packed, prefix) << std::endl; 


}